

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::~cmake(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  cmMessenger *pcVar3;
  cmFileAPI *__ptr;
  pointer pcVar4;
  _Manager_type p_Var5;
  pointer ppcVar6;
  pointer ppcVar7;
  
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
    this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  }
  ppcVar2 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar7 = (this->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar2;
      ppcVar7 = ppcVar7 + 1) {
    if (*ppcVar7 != (cmGlobalGeneratorFactory *)0x0) {
      (*(*ppcVar7)->_vptr_cmGlobalGeneratorFactory[1])();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->TraceOnlyThisSources);
  pcVar3 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (pcVar3 != (cmMessenger *)0x0) {
    operator_delete(pcVar3,4);
  }
  (this->Messenger)._M_t.super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
  super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
  super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl = (cmMessenger *)0x0;
  std::unique_ptr<cmState,_std::default_delete<cmState>_>::~unique_ptr(&this->State);
  __ptr = (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>.
          _M_t.super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
          super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl;
  if (__ptr != (cmFileAPI *)0x0) {
    std::default_delete<cmFileAPI>::operator()((default_delete<cmFileAPI> *)&this->FileAPI,__ptr);
  }
  (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
  super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
  super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl = (cmFileAPI *)0x0;
  std::unique_ptr<cmVariableWatch,_std::default_delete<cmVariableWatch>_>::~unique_ptr
            (&this->VariableWatch);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::~_Rb_tree(&(this->InstalledFiles)._M_t);
  pcVar4 = (this->GraphVizFile)._M_dataplus._M_p;
  paVar1 = &(this->GraphVizFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::~unique_ptr
            (&this->FileTimeCache);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->HeaderFileExtensionsSet)._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->HeaderFileExtensions);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->SourceFileExtensionsSet)._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SourceFileExtensions);
  pcVar4 = (this->EnvironmentGenerator)._M_dataplus._M_p;
  paVar1 = &(this->EnvironmentGenerator).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->VSSolutionFile)._M_dataplus._M_p;
  paVar1 = &(this->VSSolutionFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CheckStampList)._M_dataplus._M_p;
  paVar1 = &(this->CheckStampList).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CheckStampFile)._M_dataplus._M_p;
  paVar1 = &(this->CheckStampFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CheckBuildSystemArgument)._M_dataplus._M_p;
  paVar1 = &(this->CheckBuildSystemArgument).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CCEnvironment)._M_dataplus._M_p;
  paVar1 = &(this->CCEnvironment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CXXEnvironment)._M_dataplus._M_p;
  paVar1 = &(this->CXXEnvironment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CMakeEditCommand)._M_dataplus._M_p;
  paVar1 = &(this->CMakeEditCommand).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&(this->UsedCliVariables)._M_t);
  p_Var5 = (this->ProgressCallback).super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->ProgressCallback,(_Any_data *)&this->ProgressCallback,
              __destroy_functor);
  }
  pcVar4 = (this->GeneratorToolset)._M_dataplus._M_p;
  paVar1 = &(this->GeneratorToolset).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->GeneratorPlatform)._M_dataplus._M_p;
  paVar1 = &(this->GeneratorPlatform).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->GeneratorInstance)._M_dataplus._M_p;
  paVar1 = &(this->GeneratorInstance).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  ::~_Rb_tree(&(this->DiagLevels)._M_t);
  ppcVar6 = (this->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar6 != (pointer)0x0) {
    operator_delete(ppcVar6,(long)(this->ExtraGenerators).
                                  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar6
                   );
  }
  ppcVar7 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar7 != (pointer)0x0) {
    operator_delete(ppcVar7,(long)(this->Generators).
                                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar7
                   );
    return;
  }
  return;
}

Assistant:

cmake::~cmake()
{
  if (this->GlobalGenerator) {
    delete this->GlobalGenerator;
    this->GlobalGenerator = nullptr;
  }
  cmDeleteAll(this->Generators);
}